

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O0

void If_ManDerefChoiceCutSet(If_Man_t *p,If_Obj_t *pObj)

{
  int iVar1;
  If_Obj_t *local_20;
  If_Obj_t *pTemp;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  iVar1 = If_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    __assert_fail("If_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                  ,0x298,"void If_ManDerefChoiceCutSet(If_Man_t *, If_Obj_t *)");
  }
  if ((*(uint *)pObj >> 7 & 1) == 0) {
    __assert_fail("pObj->fRepr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                  ,0x299,"void If_ManDerefChoiceCutSet(If_Man_t *, If_Obj_t *)");
  }
  local_20 = pObj;
  if (pObj->nVisits < 1) {
    __assert_fail("pObj->nVisits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                  ,0x29a,"void If_ManDerefChoiceCutSet(If_Man_t *, If_Obj_t *)");
  }
  for (; local_20 != (If_Obj_t *)0x0; local_20 = local_20->pEquiv) {
    iVar1 = local_20->nVisits + -1;
    local_20->nVisits = iVar1;
    if (iVar1 == 0) {
      If_ManCutSetRecycle(p,local_20->pCutSet);
      local_20->pCutSet = (If_Set_t *)0x0;
    }
  }
  return;
}

Assistant:

void If_ManDerefChoiceCutSet( If_Man_t * p, If_Obj_t * pObj )
{
    If_Obj_t * pTemp;
    assert( If_ObjIsAnd(pObj) );
    assert( pObj->fRepr );
    assert( pObj->nVisits > 0 );
    // consider the nodes in the choice class
    for ( pTemp = pObj; pTemp; pTemp = pTemp->pEquiv )
    {
//        assert( pTemp == pObj || pTemp->nVisits == 1 );
        if ( --pTemp->nVisits == 0 )
        {
//            Mem_FixedEntryRecycle( p->pMemSet, (char *)pTemp->pCutSet );
            If_ManCutSetRecycle( p, pTemp->pCutSet );
            pTemp->pCutSet = NULL;
        }
    }
}